

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall
gmath::OrthoCamera::reconstructPoint(OrthoCamera *this,Vector3d *Pw,Vector2d *p,double d)

{
  _func_int **pp_Var1;
  bool bVar2;
  undefined8 uVar3;
  double *pdVar4;
  SVector<double,_2> *in_RDX;
  SVector<double,_3> *in_RSI;
  Camera *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  SVector<double,_3> *a;
  Vector3d Pc;
  SVector<double,_3> *in_stack_ffffffffffffff48;
  SVector<double,_3> *in_stack_ffffffffffffff50;
  allocator *paVar6;
  string *in_stack_ffffffffffffff68;
  InvalidArgumentException *in_stack_ffffffffffffff70;
  SVector<double,_3> local_88;
  SVector<double,_3> local_70;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  double local_20;
  SVector<double,_2> *local_18;
  SVector<double,_3> *local_10;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar2 = std::isfinite(in_XMM0_Qa);
  if (!bVar2) {
    local_55 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    paVar6 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Cannot reconstruct invalid point",paVar6);
    gutil::InvalidArgumentException::InvalidArgumentException
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_55 = 0;
    __cxa_throw(uVar3,&gutil::InvalidArgumentException::typeinfo,
                gutil::InvalidArgumentException::~InvalidArgumentException);
  }
  SVector<double,_3>::SVector(&local_70);
  dVar5 = SVector<double,_2>::operator[](local_18,0);
  pp_Var1 = in_RDI[1]._vptr_Camera;
  pdVar4 = SVector<double,_3>::operator[](&local_70,0);
  *pdVar4 = dVar5 * (double)pp_Var1;
  dVar5 = SVector<double,_2>::operator[](local_18,1);
  pp_Var1 = in_RDI[1]._vptr_Camera;
  pdVar4 = SVector<double,_3>::operator[](&local_70,1);
  *pdVar4 = -dVar5 * (double)pp_Var1;
  a = (SVector<double,_3> *)(local_20 * *(double *)&in_RDI[1].name);
  pdVar4 = SVector<double,_3>::operator[](&local_70,2);
  *pdVar4 = (double)a;
  Camera::getR(in_RDI);
  SMatrix<double,_3,_3>::operator*((SMatrix<double,_3,_3> *)in_RDI,in_stack_ffffffffffffff50);
  Camera::getT(in_RDI);
  SVector<double,_3>::operator+(in_stack_ffffffffffffff48,a);
  SVector<double,_3>::operator=(local_10,&local_88);
  return;
}

Assistant:

void OrthoCamera::reconstructPoint(Vector3d &Pw, const Vector2d &p, double d)
const
{
  if (!std::isfinite(d))
  {
    throw gutil::InvalidArgumentException("Cannot reconstruct invalid point");
  }

  Vector3d Pc;

  Pc[0]=p[0]*res;
  Pc[1]=-p[1]*res;
  Pc[2]=d*dres;

  Pw=getR()*Pc+getT();
}